

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderInvarianceBaseTest::initTest(TessellationShaderInvarianceBaseTest *this)

{
  GLenum GVar1;
  glGetUniformLocationFunc p_Var2;
  undefined1 auVar3 [4];
  int iVar4;
  GLenum GVar5;
  uint uVar6;
  GLenum GVar7;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  TessellationShaderUtils *this_00;
  TestError *pTVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  GLenum local_184;
  GLenum local_180;
  GLenum local_17c;
  GLint local_12c;
  GLchar **ppGStack_128;
  GLint link_status;
  char **xfb_names;
  string local_118 [4];
  uint n_xfb_names;
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [34];
  byte local_96;
  byte local_95;
  GLenum local_94;
  bool has_shader_been_generated;
  GLenum GStack_90;
  bool is_shader_iteration_specific;
  GLenum shader_type_es;
  GLenum shader_type;
  GLuint shader_id;
  char *shader_body_ptr;
  string shader_body;
  undefined1 local_58 [4];
  uint n_shader_type;
  _test_program program;
  uint n_iteration;
  GLenum SHADER_TYPE_VERTEX;
  GLenum SHADER_TYPE_TESSELLATION_EVALUATION;
  GLenum SHADER_TYPE_TESSELLATION_CONTROL;
  GLenum SHADER_TYPE_FRAGMENT;
  uint n_iterations;
  GLenum local_28;
  GLenum local_24;
  GLuint shared_vs_id;
  GLuint shared_te_id;
  GLuint shared_tc_id;
  GLuint shared_fs_id;
  Functions *gl;
  TessellationShaderInvarianceBaseTest *this_local;
  Functions *gl_00;
  
  pRVar8 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar4 = (*pRVar8->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar4);
  shared_te_id = 0;
  shared_vs_id = 0;
  local_24 = 0;
  local_28 = 0;
  (*gl_00->genVertexArrays)(1,&this->m_vao_id);
  GVar5 = (*gl_00->getError)();
  glu::checkError(GVar5,"Could not generate vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                  ,0x12d);
  (*gl_00->bindVertexArray)(this->m_vao_id);
  GVar5 = (*gl_00->getError)();
  glu::checkError(GVar5,"Error binding vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                  ,0x130);
  (*gl_00->genQueries)(1,&this->m_qo_tfpw_id);
  GVar5 = (*gl_00->getError)();
  glu::checkError(GVar5,"glGenQueries() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                  ,0x134);
  this_00 = (TessellationShaderUtils *)operator_new(0x20);
  TessellationShaderUtils::TessellationShaderUtils(this_00,gl_00,&this->super_TestCaseBase);
  this->m_utils_ptr = this_00;
  (*gl_00->genBuffers)(1,&this->m_bo_id);
  GVar5 = (*gl_00->getError)();
  glu::checkError(GVar5,"glGenBuffers() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                  ,0x13e);
  (*gl_00->bindBuffer)(0x8c8e,this->m_bo_id);
  GVar5 = (*gl_00->getError)();
  glu::checkError(GVar5,"glBindBuffer() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                  ,0x141);
  (*gl_00->bindBufferBase)(0x8c8e,0,this->m_bo_id);
  GVar5 = (*gl_00->getError)();
  glu::checkError(GVar5,"glBindBufferBase() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                  ,0x145);
  uVar6 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[6])();
  std::
  vector<glcts::TessellationShaderInvarianceBaseTest::_test_program,_std::allocator<glcts::TessellationShaderInvarianceBaseTest::_test_program>_>
  ::reserve(&this->m_programs,(ulong)uVar6);
  GVar5 = (this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER;
  GVar1 = (this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER;
  program.outer_tess_level_uniform_location = 0x8b31;
  program.inner_tess_level_uniform_location = 0;
  do {
    if (uVar6 <= program.inner_tess_level_uniform_location) {
      return;
    }
    local_58 = (undefined1  [4])(*gl_00->createProgram)();
    GVar7 = (*gl_00->getError)();
    glu::checkError(GVar7,"glCreateProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                    ,0x157);
    if ((initTest()::shader_types == '\0') &&
       (iVar4 = __cxa_guard_acquire(&initTest()::shader_types), iVar4 != 0)) {
      initTest::shader_types[0] = 0x8b30;
      initTest::shader_types[3] = 0x8b31;
      initTest::shader_types[1] = GVar5;
      initTest::shader_types[2] = GVar1;
      __cxa_guard_release(&initTest()::shader_types);
    }
    for (shader_body.field_2._12_4_ = 0; (uint)shader_body.field_2._12_4_ < 4;
        shader_body.field_2._12_4_ = shader_body.field_2._12_4_ + 1) {
      std::__cxx11::string::string((string *)&shader_body_ptr);
      _shader_type = (GLchar *)0x0;
      shader_type_es = 0;
      local_94 = initTest::shader_types[(uint)shader_body.field_2._12_4_];
      local_95 = 0;
      GStack_90 = local_94;
      if (local_94 == GVar1) {
        local_95 = 1;
      }
      else if (((local_94 != 0x8b30) && (local_94 != GVar5)) && (local_94 != 0x8b31)) {
        pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar9,"Unrecognized shader type",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                   ,0x170);
        __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      local_96 = 0;
      if (((local_95 == 0) && (program.inner_tess_level_uniform_location == 0)) || (local_95 != 0))
      {
        local_96 = 1;
        shader_type_es = (*gl_00->createShader)(local_94);
        GVar7 = (*gl_00->getError)();
        glu::checkError(GVar7,"glCreateShader() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                        ,0x17f);
        if (GStack_90 == 0x8b30) {
          (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[8])
                    (local_b8,this,(ulong)program.inner_tess_level_uniform_location);
          std::__cxx11::string::operator=((string *)&shader_body_ptr,local_b8);
          std::__cxx11::string::~string(local_b8);
        }
        else if (GStack_90 == GVar5) {
          (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xc])
                    (local_d8,this,(ulong)program.inner_tess_level_uniform_location);
          std::__cxx11::string::operator=((string *)&shader_body_ptr,local_d8);
          std::__cxx11::string::~string(local_d8);
        }
        else if (GStack_90 == GVar1) {
          (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xd])
                    (local_f8,this,(ulong)program.inner_tess_level_uniform_location);
          std::__cxx11::string::operator=((string *)&shader_body_ptr,local_f8);
          std::__cxx11::string::~string(local_f8);
        }
        else {
          if (GStack_90 != 0x8b31) {
            pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar9,"Unrecognized shader type",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                       ,0x194);
            __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xe])
                    (local_118,this,(ulong)program.inner_tess_level_uniform_location);
          std::__cxx11::string::operator=((string *)&shader_body_ptr,local_118);
          std::__cxx11::string::~string(local_118);
        }
        _shader_type = (GLchar *)std::__cxx11::string::c_str();
        TestCaseBase::shaderSourceSpecialized
                  (&this->super_TestCaseBase,shader_type_es,1,(GLchar **)&shader_type);
        GVar7 = (*gl_00->getError)();
        glu::checkError(GVar7,"glShaderSource() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                        ,0x19a);
        TessellationShaderUtils::compileShaders(this->m_utils_ptr,1,&shader_type_es,true);
        if ((local_95 & 1) == 0) {
          if (GStack_90 == 0x8b30) {
            shared_te_id = shader_type_es;
          }
          else if (GStack_90 == GVar5) {
            shared_vs_id = shader_type_es;
          }
          else if (GStack_90 == GVar1) {
            local_24 = shader_type_es;
          }
          else {
            if (GStack_90 != 0x8b31) {
              pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar9,"Unrecognized shader type",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                         ,0x1b6);
              __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
            }
            local_28 = shader_type_es;
          }
        }
      }
      else {
        if (local_94 == 0x8b30) {
          local_17c = shared_te_id;
        }
        else {
          if (local_94 == GVar5) {
            local_180 = shared_vs_id;
          }
          else {
            if (local_94 == GVar1) {
              local_184 = local_24;
            }
            else {
              local_184 = local_28;
            }
            local_180 = local_184;
          }
          local_17c = local_180;
        }
        shader_type_es = local_17c;
      }
      (*gl_00->attachShader)((GLuint)local_58,shader_type_es);
      GVar7 = (*gl_00->getError)();
      glu::checkError(GVar7,"glAttachShader() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                      ,0x1c6);
      if ((local_96 & 1) != 0) {
        (*gl_00->deleteShader)(shader_type_es);
        GVar7 = (*gl_00->getError)();
        glu::checkError(GVar7,"glDeleteShader() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                        ,0x1cc);
      }
      std::__cxx11::string::~string((string *)&shader_body_ptr);
    }
    xfb_names._4_4_ = 0;
    ppGStack_128 = (GLchar **)0x0;
    (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xf])
              (this,(ulong)program.inner_tess_level_uniform_location,(long)&xfb_names + 4,
               &stack0xfffffffffffffed8);
    (*gl_00->transformFeedbackVaryings)((GLuint)local_58,xfb_names._4_4_,ppGStack_128,0x8c8c);
    GVar7 = (*gl_00->getError)();
    glu::checkError(GVar7,"glTransformFeedbackVaryings() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                    ,0x1d7);
    local_12c = 0;
    (*gl_00->linkProgram)((GLuint)local_58);
    GVar7 = (*gl_00->getError)();
    glu::checkError(GVar7,"glLinkProgram() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                    ,0x1dd);
    (*gl_00->getProgramiv)((GLuint)local_58,0x8b82,&local_12c);
    GVar7 = (*gl_00->getError)();
    glu::checkError(GVar7,"glGetProgramiv() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                    ,0x1e0);
    auVar3 = local_58;
    if (local_12c != 1) {
      pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar9,"Program linking failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                 ,0x1e4);
      __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    p_Var2 = gl_00->getUniformLocation;
    iVar4 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[9])();
    n_shader_type = (*p_Var2)((GLuint)auVar3,(GLchar *)CONCAT44(extraout_var_00,iVar4));
    auVar3 = local_58;
    p_Var2 = gl_00->getUniformLocation;
    iVar4 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[10])();
    program.po_id = (*p_Var2)((GLuint)auVar3,(GLchar *)CONCAT44(extraout_var_01,iVar4));
    GVar7 = (*gl_00->getError)();
    glu::checkError(GVar7,"glGetUniformLocation() call(s) failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                    ,0x1ed);
    std::
    vector<glcts::TessellationShaderInvarianceBaseTest::_test_program,_std::allocator<glcts::TessellationShaderInvarianceBaseTest::_test_program>_>
    ::push_back(&this->m_programs,(value_type *)local_58);
    program.inner_tess_level_uniform_location = program.inner_tess_level_uniform_location + 1;
  } while( true );
}

Assistant:

void TessellationShaderInvarianceBaseTest::initTest()
{
	const glw::Functions& gl		   = m_context.getRenderContext().getFunctions();
	glw::GLuint			  shared_fs_id = 0;
	glw::GLuint			  shared_tc_id = 0;
	glw::GLuint			  shared_te_id = 0;
	glw::GLuint			  shared_vs_id = 0;

	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Initialize GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN query object */
	gl.genQueries(1, &m_qo_tfpw_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenQueries() call failed");

	/* Initialize tessellation shader utils */
	m_utils_ptr = new TessellationShaderUtils(gl, this);

	/* Initialize a buffer object we will use to store XFB data.
	 * Note: we intentionally skip a glBufferData() call here,
	 *       the actual buffer storage size is iteration-specific.
	 **/
	gl.genBuffers(1, &m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed");

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* index */
					  m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call failed");

	/* Iterate through all iterations */
	const unsigned int n_iterations = getAmountOfIterations();
	m_programs.reserve(n_iterations);

	const glw::GLenum SHADER_TYPE_FRAGMENT				  = GL_FRAGMENT_SHADER;
	const glw::GLenum SHADER_TYPE_TESSELLATION_CONTROL	= m_glExtTokens.TESS_CONTROL_SHADER;
	const glw::GLenum SHADER_TYPE_TESSELLATION_EVALUATION = m_glExtTokens.TESS_EVALUATION_SHADER;
	const glw::GLenum SHADER_TYPE_VERTEX				  = GL_VERTEX_SHADER;

	for (unsigned int n_iteration = 0; n_iteration < n_iterations; ++n_iteration)
	{
		_test_program program;

		/* Create an iteration-specific program object */
		program.po_id = gl.createProgram();

		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

		/* Query the implementation on which shader types should be compiled on
		 * a per-iteration basis, and which can be initialized only once */
		static const glw::GLenum shader_types[] = { SHADER_TYPE_FRAGMENT, SHADER_TYPE_TESSELLATION_CONTROL,
													SHADER_TYPE_TESSELLATION_EVALUATION, SHADER_TYPE_VERTEX };
		static const unsigned int n_shader_types = sizeof(shader_types) / sizeof(shader_types[0]);

		for (unsigned int n_shader_type = 0; n_shader_type < n_shader_types; ++n_shader_type)
		{
			std::string shader_body;
			const char* shader_body_ptr = DE_NULL;
			glw::GLuint shader_id		= 0;
			glw::GLenum shader_type		= shader_types[n_shader_type];
			glw::GLenum shader_type_es  = (glw::GLenum)shader_type;

			// Check whether the test should use a separate program objects for each iteration.
			bool is_shader_iteration_specific = false;
			if (shader_type == SHADER_TYPE_TESSELLATION_EVALUATION)
			{
				is_shader_iteration_specific = true;
			}
			else if ((shader_type != SHADER_TYPE_FRAGMENT) && (shader_type != SHADER_TYPE_TESSELLATION_CONTROL) &&
					 (shader_type != SHADER_TYPE_VERTEX))
			{
				TCU_FAIL("Unrecognized shader type");
			}

			/* We need to initialize the shader object if:
			 *
			 * - its body differs between iterations;
			 * - its body is shared by all iterations AND this is the first iteration
			 */
			bool has_shader_been_generated = false;

			if ((!is_shader_iteration_specific && n_iteration == 0) || is_shader_iteration_specific)
			{
				/* Create the shader object */
				has_shader_been_generated = true;
				shader_id				  = gl.createShader(shader_type_es);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed");

				/* Assign shader body to the object */
				if (shader_type == SHADER_TYPE_FRAGMENT)
				{
					shader_body = getFSCode(n_iteration);
				}
				else if (shader_type == SHADER_TYPE_TESSELLATION_CONTROL)
				{
					shader_body = getTCCode(n_iteration);
				}
				else if (shader_type == SHADER_TYPE_TESSELLATION_EVALUATION)
				{
					shader_body = getTECode(n_iteration);
				}
				else if (shader_type == SHADER_TYPE_VERTEX)
				{
					shader_body = getVSCode(n_iteration);
				}
				else
				{
					TCU_FAIL("Unrecognized shader type");
				}

				shader_body_ptr = shader_body.c_str();

				shaderSourceSpecialized(shader_id, 1, &shader_body_ptr);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed");

				/* Compile the shader object */
				m_utils_ptr->compileShaders(1,				   /* n_shaders */
											&shader_id, true); /* should_succeed */

				/* If this is a shader object that will be shared by all iterations, cache it
				 * in a dedicated variable */
				if (!is_shader_iteration_specific)
				{
					if (shader_type == SHADER_TYPE_FRAGMENT)
					{
						shared_fs_id = shader_id;
					}
					else if (shader_type == SHADER_TYPE_TESSELLATION_CONTROL)
					{
						shared_tc_id = shader_id;
					}
					else if (shader_type == SHADER_TYPE_TESSELLATION_EVALUATION)
					{
						shared_te_id = shader_id;
					}
					else if (shader_type == SHADER_TYPE_VERTEX)
					{
						shared_vs_id = shader_id;
					}
					else
					{
						TCU_FAIL("Unrecognized shader type");
					}
				} /* if (!is_shader_iteration_specific) */
			}	 /* if (shader object needs to be initialized) */
			else
			{
				shader_id = (shader_type == SHADER_TYPE_FRAGMENT) ?
								shared_fs_id :
								(shader_type == SHADER_TYPE_TESSELLATION_CONTROL) ?
								shared_tc_id :
								(shader_type == SHADER_TYPE_TESSELLATION_EVALUATION) ? shared_te_id : shared_vs_id;
			}

			/* Attach the shader object to iteration-specific program object */
			gl.attachShader(program.po_id, shader_id);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call failed.");

			/* Now that the object has been attached, we can flag it for deletion */
			if (has_shader_been_generated)
			{
				gl.deleteShader(shader_id);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteShader() call failed");
			}
		} /* for (all shader types) */

		/* Set up transform feed-back */
		unsigned int n_xfb_names = 0;
		const char** xfb_names   = NULL;

		getXFBProperties(n_iteration, &n_xfb_names, &xfb_names);

		gl.transformFeedbackVaryings(program.po_id, n_xfb_names, xfb_names, GL_INTERLEAVED_ATTRIBS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call failed.");

		/* Try to link the program object */
		glw::GLint link_status = GL_FALSE;

		gl.linkProgram(program.po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed");

		gl.getProgramiv(program.po_id, GL_LINK_STATUS, &link_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed");

		if (link_status != GL_TRUE)
		{
			TCU_FAIL("Program linking failed");
		}

		/* Retrieve inner/outer tess level uniform locations */
		program.inner_tess_level_uniform_location =
			gl.getUniformLocation(program.po_id, getInnerTessLevelUniformName());
		program.outer_tess_level_uniform_location =
			gl.getUniformLocation(program.po_id, getOuterTessLevelUniformName());

		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformLocation() call(s) failed");

		/* Store the program object */
		m_programs.push_back(program);
	} /* for (all iterations) */
}